

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_database.cc
# Opt level: O2

bool __thiscall
google::protobuf::SimpleDescriptorDatabase::Add
          (SimpleDescriptorDatabase *this,FileDescriptorProto *file)

{
  bool bVar1;
  FileDescriptorProto *this_00;
  
  this_00 = (FileDescriptorProto *)operator_new(0xe0);
  FileDescriptorProto::FileDescriptorProto(this_00);
  FileDescriptorProto::CopyFrom(this_00,file);
  bVar1 = AddAndOwn(this,this_00);
  return bVar1;
}

Assistant:

bool SimpleDescriptorDatabase::Add(const FileDescriptorProto& file) {
  FileDescriptorProto* new_file = new FileDescriptorProto;
  new_file->CopyFrom(file);
  return AddAndOwn(new_file);
}